

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_complexity.c
# Opt level: O0

void av1_caq_select_segment
               (AV1_COMP *cpi,MACROBLOCK *mb,BLOCK_SIZE bs,int mi_row,int mi_col,int projected_rate)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MACROBLOCK *x;
  int in_ECX;
  byte in_DL;
  AV1_COMP *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar8;
  int mi_stride;
  int aq_strength;
  double low_var_thresh;
  double logvar;
  int target_rate;
  int denom;
  int64_t num;
  uchar segment;
  int i;
  int ymis;
  int xmis;
  int mi_offset;
  int num_planes;
  AV1_COMMON *cm;
  uint8_t in_stack_ffffffffffffff7f;
  undefined8 in_stack_ffffffffffffff80;
  double dVar9;
  double in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar10;
  uint uVar11;
  
  _Var1 = is_frame_aq_enabled((AV1_COMP *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if ((_Var1) && (_Var1 = is_sb_aq_enabled(in_RDI), _Var1)) {
    av1_num_planes(&in_RDI->common);
    if ((in_RDI->common).mi_params.mi_cols - in_R8D <
        (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [in_DL]) {
      uVar2 = (in_RDI->common).mi_params.mi_cols - in_R8D;
    }
    else {
      uVar2 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [in_DL];
    }
    if ((in_RDI->common).mi_params.mi_rows - in_ECX <
        (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [in_DL]) {
      uVar3 = (in_RDI->common).mi_params.mi_rows - in_ECX;
    }
    else {
      uVar3 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [in_DL];
    }
    x = (MACROBLOCK *)((long)(int)((in_RDI->rc).sb64_target_rate * uVar2 * uVar3) << 9);
    iVar4 = ((in_RDI->common).seq_params)->mib_size * ((in_RDI->common).seq_params)->mib_size;
    iVar5 = (int)((long)x / (long)iVar4);
    uVar10 = uVar3;
    uVar11 = uVar2;
    iVar6 = get_aq_c_strength((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                              (aom_bit_depth_t)in_stack_ffffffffffffff80);
    iVar7 = is_stat_consumption_stage_twopass(in_RDI);
    if (iVar7 == 0) {
      dVar8 = 10.0;
    }
    else {
      dVar8 = exp((in_RDI->twopass_frame).mb_av_energy);
      if (dVar8 <= 8.0) {
        dVar8 = 8.0;
        in_stack_ffffffffffffff88 = dVar8;
      }
      else {
        dVar8 = exp((in_RDI->twopass_frame).mb_av_energy);
        in_stack_ffffffffffffff88 = dVar8;
      }
    }
    dVar9 = dVar8;
    av1_setup_src_planes
              ((MACROBLOCK *)CONCAT44(uVar11,uVar10),
               (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)x >> 0x20),(int)x,iVar4,(BLOCK_SIZE)((uint)iVar5 >> 0x18));
    iVar4 = av1_log_block_var((AV1_COMP *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),x,
                              (BLOCK_SIZE)((uint)iVar4 >> 0x18));
    iVar7 = 0;
    while ((iVar7 < 5 &&
           (((double)iVar5 * aq_c_transitions[iVar6][iVar7] <= (double)in_R9D ||
            (dVar8 + aq_c_var_thresholds[iVar6][iVar7] <= (double)iVar4))))) {
      iVar7 = iVar7 + 1;
    }
    set_segment_id((uint8_t *)CONCAT44(uVar2,uVar3),(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   SUB84(in_stack_ffffffffffffff88,0),(int)((ulong)dVar9 >> 0x20),SUB84(dVar9,0),
                   in_stack_ffffffffffffff7f);
  }
  return;
}

Assistant:

void av1_caq_select_segment(const AV1_COMP *cpi, MACROBLOCK *mb, BLOCK_SIZE bs,
                            int mi_row, int mi_col, int projected_rate) {
  if ((!is_frame_aq_enabled(cpi)) || (!is_sb_aq_enabled(cpi))) return;
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);

  const int mi_offset = mi_row * cm->mi_params.mi_cols + mi_col;
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, mi_size_wide[bs]);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, mi_size_high[bs]);
  int i;
  unsigned char segment;

  // Rate depends on fraction of a SB64 in frame (xmis * ymis / bw * bh).
  // It is converted to bits << AV1_PROB_COST_SHIFT units.
  const int64_t num = (int64_t)(cpi->rc.sb64_target_rate * xmis * ymis)
                      << AV1_PROB_COST_SHIFT;
  const int denom = cm->seq_params->mib_size * cm->seq_params->mib_size;
  const int target_rate = (int)(num / denom);
  double logvar;
  double low_var_thresh;
  const int aq_strength = get_aq_c_strength(cm->quant_params.base_qindex,
                                            cm->seq_params->bit_depth);

  low_var_thresh =
      (is_stat_consumption_stage_twopass(cpi))
          ? AOMMAX(exp(cpi->twopass_frame.mb_av_energy), MIN_DEFAULT_LV_THRESH)
          : DEFAULT_LV_THRESH;

  av1_setup_src_planes(mb, cpi->source, mi_row, mi_col, num_planes, bs);
  logvar = av1_log_block_var(cpi, mb, bs);

  segment = AQ_C_SEGMENTS - 1;  // Just in case no break out below.
  for (i = 0; i < AQ_C_SEGMENTS; ++i) {
    // Test rate against a threshold value and variance against a threshold.
    // Increasing segment number (higher variance and complexity) = higher Q.
    if ((projected_rate < target_rate * aq_c_transitions[aq_strength][i]) &&
        (logvar < (low_var_thresh + aq_c_var_thresholds[aq_strength][i]))) {
      segment = i;
      break;
    }
  }

  // Fill in the entires in the segment map corresponding to this SB64.
  const int mi_stride = cm->mi_params.mi_cols;
  set_segment_id(cpi->enc_seg.map, mi_offset, xmis, ymis, mi_stride, segment);
}